

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixFileControl(sqlite3_file *id,int op,void *pArg)

{
  uint uVar1;
  long lVar2;
  sqlite3_io_methods *psVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  uint *puVar9;
  int iErrno;
  int iVar10;
  long lVar11;
  sqlite3_io_methods *psVar12;
  long iOff;
  long lVar13;
  long lVar14;
  stat buf;
  undefined8 local_c8;
  _func_int_sqlite3_file_ptr *p_Stack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  long local_98;
  int local_90;
  
  iVar5 = 0xc;
  switch(op) {
  case 1:
    uVar7 = (uint)*(byte *)((long)&id[3].pMethods + 4);
    goto LAB_001272b0;
  case 2:
  case 3:
  case 7:
  case 8:
  case 9:
  case 0xb:
  case 0xe:
  case 0xf:
  case 0x11:
  case 0x13:
    break;
  case 4:
    uVar7 = *(uint *)&id[4].pMethods;
    goto LAB_001272b0;
  case 5:
    lVar2 = *pArg;
    if (0 < *(int *)&id[9].pMethods) {
      iVar5 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&id[3].pMethods,&local_c8);
      if (iVar5 != 0) {
        return 0x70a;
      }
      lVar14 = lVar2 + *(int *)&id[9].pMethods + -1;
      lVar14 = lVar14 - lVar14 % (long)*(int *)&id[9].pMethods;
      if (local_98 < lVar14) {
        lVar11 = (long)local_90;
        iOff = local_98 + lVar11 + ~(local_98 % lVar11);
        lVar13 = lVar14 + lVar11 + -1;
        if (iOff < lVar13) {
          do {
            if (lVar14 <= iOff) {
              iOff = lVar14 + -1;
            }
            iVar5 = seekAndWriteFd(*(int *)&id[3].pMethods,iOff,"",1,(int *)(id + 4));
            if (iVar5 != 1) {
              return 0x30a;
            }
            iOff = iOff + lVar11;
          } while (iOff < lVar13);
        }
      }
    }
    iVar5 = 0;
    if ((0 < (long)id[0xc].pMethods) && ((long)id[10].pMethods < lVar2)) {
      if (*(int *)&id[9].pMethods < 1) {
        uVar7 = *(uint *)&id[3].pMethods;
        do {
          iVar5 = (*aSyscall[6].pCurrent)((ulong)uVar7,lVar2);
          if (-1 < iVar5) {
            if (iVar5 == 0) goto LAB_0012717d;
            puVar9 = (uint *)__errno_location();
            uVar1 = *puVar9;
            break;
          }
          puVar9 = (uint *)__errno_location();
          uVar1 = *puVar9;
        } while (uVar1 == 4);
        *(uint *)&id[4].pMethods = uVar1;
        psVar12 = id[7].pMethods;
        if (psVar12 == (sqlite3_io_methods *)0x0) {
          psVar12 = (sqlite3_io_methods *)0x1a4219;
        }
        iVar5 = 0x60a;
        sqlite3_log(0x60a,"os_unix.c:%d: (%d) %s(%s) - %s",0x99e7,(ulong)uVar1,"ftruncate",psVar12,
                    "");
      }
      else {
LAB_0012717d:
        iVar5 = unixMapfile((unixFile *)id,lVar2);
      }
    }
    break;
  case 6:
    *(undefined4 *)&id[9].pMethods = *pArg;
    goto LAB_001272c5;
  case 10:
    if (-1 < *pArg) {
      uVar4 = *(ushort *)((long)&id[3].pMethods + 6);
      if (*pArg == 0) {
        uVar4 = uVar4 & 0xfffb;
      }
      else {
        uVar4 = uVar4 | 4;
      }
      goto LAB_001272c1;
    }
    uVar4 = *(ushort *)((long)&id[3].pMethods + 6) >> 2;
LAB_001272ad:
    uVar7 = uVar4 & 1;
LAB_001272b0:
    *(uint *)pArg = uVar7;
    goto LAB_001272c5;
  case 0xc:
    iVar5 = 0;
    pcVar8 = sqlite3_mprintf("%s",(id[1].pMethods)->xWrite);
    *(char **)pArg = pcVar8;
    break;
  case 0xd:
    if (*pArg < 0) {
      uVar4 = *(ushort *)((long)&id[3].pMethods + 6) >> 4;
      goto LAB_001272ad;
    }
    uVar4 = *(ushort *)((long)&id[3].pMethods + 6);
    if (*pArg == 0) {
      uVar4 = uVar4 & 0xffef;
    }
    else {
      uVar4 = uVar4 | 0x10;
    }
LAB_001272c1:
    *(ushort *)((long)&id[3].pMethods + 6) = uVar4;
    goto LAB_001272c5;
  case 0x10:
    iVar10 = *(int *)&(id[1].pMethods)->xClose;
    iVar6 = sqlite3_initialize();
    iVar5 = 0;
    if ((iVar6 == 0) && (pcVar8 = (char *)sqlite3Malloc((long)iVar10), pcVar8 != (char *)0x0)) {
      unixGetTempname(*(int *)&(id[1].pMethods)->xClose,pcVar8);
      *(char **)pArg = pcVar8;
    }
    break;
  case 0x12:
    psVar12 = (sqlite3_io_methods *)sqlite3Config.mxMmap;
    if ((long)*pArg < sqlite3Config.mxMmap) {
      psVar12 = *pArg;
    }
    psVar3 = id[0xc].pMethods;
    *(sqlite3_io_methods **)pArg = psVar3;
    iVar5 = 0;
    if (((psVar12 != psVar3 && -1 < (long)psVar12) && (*(int *)((long)&id[9].pMethods + 4) == 0)) &&
       (id[0xc].pMethods = psVar12, iVar5 = 0, 0 < (long)id[10].pMethods)) {
      if (id[0xd].pMethods != (sqlite3_io_methods *)0x0) {
        (*aSyscall[0x17].pCurrent)(id[0xd].pMethods,id[0xb].pMethods);
        id[0xd].pMethods = (sqlite3_io_methods *)0x0;
        id[10].pMethods = (sqlite3_io_methods *)0x0;
        id[0xb].pMethods = (sqlite3_io_methods *)0x0;
      }
      iVar5 = unixMapfile((unixFile *)id,-1);
      return iVar5;
    }
    break;
  case 0x14:
    uVar7 = 0;
    if (id[2].pMethods != (sqlite3_io_methods *)0x0) {
      iVar5 = (*aSyscall[4].pCurrent)(id[7].pMethods,&local_c8);
      uVar7 = 1;
      if (iVar5 == 0) {
        uVar7 = (uint)(p_Stack_c0 != (id[2].pMethods)->xClose);
      }
    }
    *(uint *)pArg = uVar7;
    iVar5 = 0;
    break;
  default:
    if (op != 0x28) {
      return 0xc;
    }
    psVar12 = id[8].pMethods;
    *(undefined4 *)pArg = 0;
    if (psVar12 != (sqlite3_io_methods *)0x0) {
      lVar2 = *(long *)psVar12;
      uStack_b0 = 0;
      local_c8 = 1;
      p_Stack_c0 = (_func_int_sqlite3_file_ptr *)0x7b;
      local_b8 = 5;
      if (*(sqlite3_mutex **)(lVar2 + 8) != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(lVar2 + 8));
      }
      iVar10 = 0;
      iVar5 = (*aSyscall[7].pCurrent)((ulong)*(uint *)(lVar2 + 0x18),5,&local_c8);
      if (iVar5 < 0) {
        iVar10 = 0xf0a;
      }
      else {
        *(uint *)pArg = (uint)((short)local_c8 != 2);
      }
      if (*(sqlite3_mutex **)(lVar2 + 8) == (sqlite3_mutex *)0x0) {
        return iVar10;
      }
      (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(lVar2 + 8));
      return iVar10;
    }
LAB_001272c5:
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int unixFileControl(sqlite3_file *id, int op, void *pArg){
  unixFile *pFile = (unixFile*)id;
  switch( op ){
#if defined(__linux__) && defined(SQLITE_ENABLE_BATCH_ATOMIC_WRITE)
    case SQLITE_FCNTL_BEGIN_ATOMIC_WRITE: {
      int rc = osIoctl(pFile->h, F2FS_IOC_START_ATOMIC_WRITE);
      return rc ? SQLITE_IOERR_BEGIN_ATOMIC : SQLITE_OK;
    }
    case SQLITE_FCNTL_COMMIT_ATOMIC_WRITE: {
      int rc = osIoctl(pFile->h, F2FS_IOC_COMMIT_ATOMIC_WRITE);
      return rc ? SQLITE_IOERR_COMMIT_ATOMIC : SQLITE_OK;
    }
    case SQLITE_FCNTL_ROLLBACK_ATOMIC_WRITE: {
      int rc = osIoctl(pFile->h, F2FS_IOC_ABORT_VOLATILE_WRITE);
      return rc ? SQLITE_IOERR_ROLLBACK_ATOMIC : SQLITE_OK;
    }
#endif /* __linux__ && SQLITE_ENABLE_BATCH_ATOMIC_WRITE */

    case SQLITE_FCNTL_LOCKSTATE: {
      *(int*)pArg = pFile->eFileLock;
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_LAST_ERRNO: {
      *(int*)pArg = pFile->lastErrno;
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_CHUNK_SIZE: {
      pFile->szChunk = *(int *)pArg;
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_SIZE_HINT: {
      int rc;
      SimulateIOErrorBenign(1);
      rc = fcntlSizeHint(pFile, *(i64 *)pArg);
      SimulateIOErrorBenign(0);
      return rc;
    }
    case SQLITE_FCNTL_PERSIST_WAL: {
      unixModeBit(pFile, UNIXFILE_PERSIST_WAL, (int*)pArg);
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_POWERSAFE_OVERWRITE: {
      unixModeBit(pFile, UNIXFILE_PSOW, (int*)pArg);
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_VFSNAME: {
      *(char**)pArg = sqlite3_mprintf("%s", pFile->pVfs->zName);
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_TEMPFILENAME: {
      char *zTFile = sqlite3_malloc64( pFile->pVfs->mxPathname );
      if( zTFile ){
        unixGetTempname(pFile->pVfs->mxPathname, zTFile);
        *(char**)pArg = zTFile;
      }
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_HAS_MOVED: {
      *(int*)pArg = fileHasMoved(pFile);
      return SQLITE_OK;
    }
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
    case SQLITE_FCNTL_LOCK_TIMEOUT: {
      int iOld = pFile->iBusyTimeout;
      pFile->iBusyTimeout = *(int*)pArg;
      *(int*)pArg = iOld;
      return SQLITE_OK;
    }
#endif
#if SQLITE_MAX_MMAP_SIZE>0
    case SQLITE_FCNTL_MMAP_SIZE: {
      i64 newLimit = *(i64*)pArg;
      int rc = SQLITE_OK;
      if( newLimit>sqlite3GlobalConfig.mxMmap ){
        newLimit = sqlite3GlobalConfig.mxMmap;
      }

      /* The value of newLimit may be eventually cast to (size_t) and passed
      ** to mmap(). Restrict its value to 2GB if (size_t) is not at least a
      ** 64-bit type. */
      if( newLimit>0 && sizeof(size_t)<8 ){
        newLimit = (newLimit & 0x7FFFFFFF);
      }

      *(i64*)pArg = pFile->mmapSizeMax;
      if( newLimit>=0 && newLimit!=pFile->mmapSizeMax && pFile->nFetchOut==0 ){
        pFile->mmapSizeMax = newLimit;
        if( pFile->mmapSize>0 ){
          unixUnmapfile(pFile);
          rc = unixMapfile(pFile, -1);
        }
      }
      return rc;
    }
#endif
#ifdef SQLITE_DEBUG
    /* The pager calls this method to signal that it has done
    ** a rollback and that the database is therefore unchanged and
    ** it hence it is OK for the transaction change counter to be
    ** unchanged.
    */
    case SQLITE_FCNTL_DB_UNCHANGED: {
      ((unixFile*)id)->dbUpdate = 0;
      return SQLITE_OK;
    }
#endif
#if SQLITE_ENABLE_LOCKING_STYLE && defined(__APPLE__)
    case SQLITE_FCNTL_SET_LOCKPROXYFILE:
    case SQLITE_FCNTL_GET_LOCKPROXYFILE: {
      return proxyFileControl(id,op,pArg);
    }
#endif /* SQLITE_ENABLE_LOCKING_STYLE && defined(__APPLE__) */

    case SQLITE_FCNTL_EXTERNAL_READER: {
#ifndef SQLITE_OMIT_WAL
      return unixFcntlExternalReader((unixFile*)id, (int*)pArg);
#else
      *(int*)pArg = 0;
      return SQLITE_OK;
#endif
    }
  }
  return SQLITE_NOTFOUND;
}